

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

bool ON::GetFileStats(wchar_t *filename,size_t *filesize,time_t *create_time,time_t *lastmodify_time
                     )

{
  bool bVar1;
  FILE *fp;
  
  if (filesize != (size_t *)0x0) {
    *filesize = 0;
  }
  if (create_time != (time_t *)0x0) {
    *create_time = 0;
  }
  if (lastmodify_time != (time_t *)0x0) {
    *lastmodify_time = 0;
  }
  if (((filename != (wchar_t *)0x0) && (*filename != L'\0')) &&
     (fp = OpenFile(filename,L"rb"), fp != (FILE *)0x0)) {
    bVar1 = GetFileStats(fp,filesize,create_time,lastmodify_time);
    CloseFile(fp);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON::GetFileStats( const wchar_t* filename,
                       size_t* filesize,
                       time_t* create_time,
                       time_t* lastmodify_time
                      )
{
  bool rc = false;

  if (filesize)
    *filesize = 0;
  if (create_time)
    *create_time = 0;
  if (lastmodify_time)
    *lastmodify_time = 0;

  if ( filename && filename[0] )
  {
    FILE* fp = ON::OpenFile(filename,L"rb");
    if ( fp )
    {
      rc = ON::GetFileStats(fp,filesize,create_time,lastmodify_time);
      ON::CloseFile(fp);
    }
  }

  return rc;
}